

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

Header * __thiscall
kj::Vector<kj::HttpHeaders::Header>::add<kj::HttpHeaders::Header>
          (Vector<kj::HttpHeaders::Header> *this,Header *params)

{
  Header *pHVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  RemoveConst<kj::HttpHeaders::Header> *pRVar5;
  
  pRVar5 = (this->builder).pos;
  if (pRVar5 == (this->builder).endPtr) {
    grow(this,0);
    pRVar5 = (this->builder).pos;
  }
  pcVar2 = (params->name).content.ptr;
  sVar3 = (params->name).content.size_;
  sVar4 = (params->value).content.size_;
  (pRVar5->value).content.ptr = (params->value).content.ptr;
  (pRVar5->value).content.size_ = sVar4;
  (pRVar5->name).content.ptr = pcVar2;
  (pRVar5->name).content.size_ = sVar3;
  pHVar1 = (this->builder).pos;
  (this->builder).pos = pHVar1 + 1;
  return pHVar1;
}

Assistant:

inline T& add(Params&&... params) {
    if (builder.isFull()) grow();
    return builder.add(kj::fwd<Params>(params)...);
  }